

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Format.cpp
# Opt level: O0

bool Format::FromSize(int64_t size,Format *fmt)

{
  Format local_494;
  Format local_458;
  Format local_41c;
  Format local_3e0;
  Format local_3a4;
  Format local_368;
  Format local_32c;
  Format local_2f0;
  Format local_2b4;
  Format local_278;
  Format local_23c;
  Format local_200;
  Format local_1c4;
  Format local_188;
  Format local_14c;
  Format local_110;
  Format local_d4;
  Format local_98;
  Format local_5c;
  Format *local_20;
  Format *fmt_local;
  int64_t size_local;
  
  local_20 = fmt;
  fmt_local = (Format *)size;
  if (size == 0x23000) {
    Format(&local_5c,DO);
    memcpy(local_20,&local_5c,0x3a);
  }
  else if (size == 0x28000) {
    Format(&local_98,PC320);
    memcpy(local_20,&local_98,0x3a);
    local_20->heads = 1;
  }
  else if (size == 0x2d000) {
    Format(&local_d4,PC360);
    memcpy(local_20,&local_d4,0x3a);
    local_20->heads = 1;
  }
  else if (size == 0x50000) {
    Format(&local_110,PC320);
    memcpy(local_20,&local_110,0x3a);
  }
  else if (size == 0x5a000) {
    Format(&local_14c,PC360);
    memcpy(local_20,&local_14c,0x3a);
  }
  else if (size == 0xa0000) {
    Format(&local_188,PC640);
    memcpy(local_20,&local_188,0x3a);
  }
  else if (size == 0xb4000) {
    Format(&local_1c4,PC720);
    memcpy(local_20,&local_1c4,0x3a);
  }
  else if (size == 0xc8000) {
    Format(&local_200,MGT);
    memcpy(local_20,&local_200,0x3a);
  }
  else if (size == 0x12c000) {
    Format(&local_23c,PC1200);
    memcpy(local_20,&local_23c,0x3a);
  }
  else if ((char *)size == "NSt18condition_variable4waitERSt11unique_lockISt5mutexE") {
    Format(&local_278,PC1232);
    memcpy(local_20,&local_278,0x3a);
  }
  else if ((char *)size == "N9__gnu_cxx12_Lock_policyE2EE5_Impl8_M_allocEv") {
    Format(&local_2b4,PC1440);
    memcpy(local_20,&local_2b4,0x3a);
  }
  else if ((char *)size == "13_M_deallocateEv") {
    Format(&local_2f0,PC1440);
    memcpy(local_20,&local_2f0,0x3a);
    local_20->sectors = 0x14;
    local_20->gap3 = 0;
  }
  else if ((char *)size == "KSt6vectorI4DataSaIS0_EE6cbeginEv") {
    Format(&local_32c,PC1440);
    memcpy(local_20,&local_32c,0x3a);
    local_20->sectors = 0x15;
    local_20->gap3 = 0;
  }
  else if (size == 0x1ae800) {
    Format(&local_368,PC1440);
    memcpy(local_20,&local_368,0x3a);
    local_20->cyls = 0x52;
    local_20->sectors = 0x15;
    local_20->gap3 = 0;
  }
  else if (size == 0x1b3c00) {
    Format(&local_3a4,PC1440);
    memcpy(local_20,&local_3a4,0x3a);
    local_20->cyls = 0x53;
    local_20->sectors = 0x15;
    local_20->gap3 = 0;
  }
  else if (size == 0x1b8000) {
    Format(&local_3e0,PC1440);
    memcpy(local_20,&local_3e0,0x3a);
    local_20->sectors = 0x16;
    local_20->gap3 = 0;
  }
  else if (size == 0x1cc000) {
    Format(&local_41c,PC1440);
    memcpy(local_20,&local_41c,0x3a);
    local_20->sectors = 0x17;
    local_20->gap3 = 0;
  }
  else if (size == 0x1e0000) {
    Format(&local_458,PC1440);
    memcpy(local_20,&local_458,0x3a);
    local_20->sectors = 0x18;
    local_20->gap3 = 0;
  }
  else {
    if ((uleb128 *)size != &uleb128_002d0000) {
      return false;
    }
    Format(&local_494,PC2880);
    memcpy(local_20,&local_494,0x3a);
  }
  return true;
}

Assistant:

bool Format::FromSize(int64_t size, Format& fmt)
{
    switch (size)
    {
    case 143360:    // Apple ][
        fmt = RegularFormat::DO;
        break;

    case 163840:    // 5.25" SSSD (160K)
        fmt = RegularFormat::PC320;
        fmt.heads = 1;
        break;

    case 184320:    // 5.25" SSSD (180K)
        fmt = RegularFormat::PC360;
        fmt.heads = 1;
        break;

    case 327680:    // 5.25" DSDD (320K)
        fmt = RegularFormat::PC320;
        break;

    case 368640:    // 5.25" DSDD (360K)
        fmt = RegularFormat::PC360;
        break;

    case 655360:    // 3.5"  DSDD (640K)
        fmt = RegularFormat::PC640;
        break;

    case 737280:    // 3.5"  DSDD (720K)
        fmt = RegularFormat::PC720;
        break;

    case 819200:    // MGT (800K), for legacy matching.
        fmt = RegularFormat::MGT;
        break;

    case 1228800:   // 5.25" DSHD (1200K)
        fmt = RegularFormat::PC1200;
        break;

    case 1261568:   // 5.25" DSHD (1232K)
        fmt = RegularFormat::PC1232;
        break;

    case 1474560:   // 3.5"  DSHD (1440K)
        fmt = RegularFormat::PC1440;
        break;

    case 1638400:   // 3.5"  DSHD (1600K)
        fmt = RegularFormat::PC1440;
        fmt.sectors = 20;
        fmt.gap3 = 0;
        break;

    case 1720320:   // 3.5"  DSHD (1680K)
        fmt = RegularFormat::PC1440;
        fmt.sectors = 21;
        fmt.gap3 = 0;
        break;

    case 1763328:   // 3.5"  DSHD (1722K)
        fmt = RegularFormat::PC1440;
        fmt.cyls = 82;
        fmt.sectors = 21;
        fmt.gap3 = 0;
        break;

    case 1784832:   // 3.5"  DSHD (1743K)
        fmt = RegularFormat::PC1440;
        fmt.cyls = 83;
        fmt.sectors = 21;
        fmt.gap3 = 0;
        break;

    case 1802240:   // 3.5"  DSHD (1760K)
        fmt = RegularFormat::PC1440;
        fmt.sectors = 22;
        fmt.gap3 = 0;
        break;

    case 1884160:   // 3.5"  DSHD (1840K)
        fmt = RegularFormat::PC1440;
        fmt.sectors = 23;
        fmt.gap3 = 0;
        break;

    case 1966080:   // 3.5"  DSHD (1920K)
        fmt = RegularFormat::PC1440;
        fmt.sectors = 24;
        fmt.gap3 = 0;
        break;

    case 2949120:   // 3.5"  DSED (2880K)
        fmt = RegularFormat::PC2880;
        break;

    default:
        return false;
    }

    return true;
}